

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O1

Identifier __thiscall
soul::BlockBuilder::createIdentifier(BlockBuilder *this,char *prefix,uint32_t index)

{
  size_t sVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  Identifier IVar6;
  long *plVar7;
  uint32_t uVar8;
  string_view newString;
  string __str;
  long *local_68;
  long local_58;
  long lStack_50;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  cVar4 = '\x01';
  if (9 < index) {
    uVar8 = index;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_002200fa;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_002200fa;
      }
      if (uVar8 < 10000) goto LAB_002200fa;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_002200fa:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_48,local_40,index);
  strlen(prefix);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)prefix);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_58 = *plVar7;
    lStack_50 = plVar5[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar7;
    local_68 = (long *)*plVar5;
  }
  sVar1 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  newString._M_str = (char *)local_68;
  newString._M_len = sVar1;
  IVar6 = Identifier::Pool::get(&this->module->allocator->identifiers,newString);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return (Identifier)IVar6.name;
}

Assistant:

Identifier createIdentifier (const char* prefix, uint32_t index)    { return createIdentifier (prefix + std::to_string (index)); }